

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

string * __thiscall
duckdb::StringType::GetCollation_abi_cxx11_
          (string *__return_storage_ptr__,StringType *this,LogicalType *type)

{
  ExtraTypeInfo *pEVar1;
  optional_ptr<duckdb::ExtraTypeInfo,_true> info;
  optional_ptr<duckdb::ExtraTypeInfo,_true> local_10;
  
  if (((*this == (StringType)0x19) &&
      (local_10.ptr = *(ExtraTypeInfo **)(this + 8), local_10.ptr != (ExtraTypeInfo *)0x0)) &&
     (pEVar1 = optional_ptr<duckdb::ExtraTypeInfo,_true>::operator->(&local_10),
     pEVar1->type != GENERIC_TYPE_INFO)) {
    pEVar1 = optional_ptr<duckdb::ExtraTypeInfo,_true>::operator->(&local_10);
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(pEVar1 + 1));
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

string StringType::GetCollation(const LogicalType &type) {
	if (type.id() != LogicalTypeId::VARCHAR) {
		return string();
	}
	auto info = type.AuxInfo();
	if (!info) {
		return string();
	}
	if (info->type == ExtraTypeInfoType::GENERIC_TYPE_INFO) {
		return string();
	}
	return info->Cast<StringTypeInfo>().collation;
}